

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

LogHelper *
util::operator<<(LogHelper *h,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  LogHelper *h_local;
  
  if ((h->clearline & 1U) != 0) {
    h->clearline = false;
    operator<<(h,clearline);
  }
  std::operator<<(h->screen,(string *)t);
  if ((h->file != (ostream *)0x0) && ((h->statusmsg & 1U) == 0)) {
    std::operator<<(h->file,(string *)t);
  }
  return h;
}

Assistant:

LogHelper& operator<<(LogHelper& h, const T& t)
{
    if (h.clearline)
    {
        h.clearline = false;
        h << ttycmd::clearline;
    }

    *h.screen << t;
    if (h.file && !h.statusmsg) *h.file << t;
    return h;
}